

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

Var Js::InterpreterStackFrame::InterpreterHelper
              (ScriptFunction *function,ArgumentReader *args,void *returnAddress,
              void *addressOfReturnAddress,AsmJsReturnStruct *asmJsReturn)

{
  ulong uVar1;
  uint8 uVar2;
  byte bVar3;
  ImplicitCallFlags flags;
  ushort uVar4;
  uint uVar5;
  ScriptContext *this;
  ThreadContext *this_00;
  Type *pTVar6;
  code *pcVar7;
  long lVar8;
  Type TVar9;
  ArenaAllocator *pAVar10;
  void *pvVar11;
  DynamicProfileInfo *this_01;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  BOOL BVar15;
  uint32 uVar16;
  RegSlot RVar17;
  int *piVar18;
  undefined4 *puVar19;
  FunctionBody *this_02;
  Var pvVar20;
  LoopHeader *loopHeaderArray;
  undefined1 this_03 [8];
  ExecutionInfoManager *pEVar21;
  int64 *piVar22;
  ulong uVar23;
  ExecutionInfoManager *pEVar24;
  Var *ppvVar25;
  PVOID unaff_retaddr;
  ThreadContext *pTStack_f0;
  undefined1 local_e8 [8];
  JavascriptGenerator *generator;
  uint local_c0;
  uint local_bc;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *local_a8;
  ArenaAllocator *tmpAlloc;
  void *local_98;
  DynamicProfileInfo *local_90;
  uint local_84;
  int *local_80;
  undefined1 auStack_78 [8];
  TTDExceptionFramePopper exceptionFramePopper;
  
  pEVar21 = (ExecutionInfoManager *)local_e8;
  piVar22 = (int64 *)local_e8;
  pTStack_f0 = (ThreadContext *)0x89981e;
  piVar18 = (int *)__tls_get_addr(&PTR_013e5d40);
  *piVar18 = *piVar18 + 1;
  pTStack_f0 = (ThreadContext *)0x899838;
  local_80 = piVar18;
  bVar12 = ConfigFlagsTable::IsEnabled
                     ((ConfigFlagsTable *)&Configuration::Global,
                      InjectPartiallyInitializedInterpreterFrameErrorFlag);
  tmpAlloc = (ArenaAllocator *)addressOfReturnAddress;
  local_98 = returnAddress;
  if ((bVar12) && (DAT_0143bfe8 == *piVar18)) {
    if ((DAT_0143bfec != 0) && (DAT_0143bfec == 1)) {
      pTStack_f0 = (ThreadContext *)0x899fa2;
      JavascriptError::MapAndThrowError
                ((((((function->super_ScriptFunctionBase).super_JavascriptFunction.
                     super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                 super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5ffcd);
    }
LAB_00899fa2:
    pcVar7 = (code *)invalidInstructionException();
    (*pcVar7)();
  }
  this = (((((function->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
             super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase)
         .scriptContext.ptr;
  this_00 = this->threadContext;
  if ((this_00->disableImplicitFlags & DisableImplicitExceptionFlag) != DisableImplicitNoFlag) {
    AssertCount = AssertCount + 1;
    pTStack_f0 = (ThreadContext *)0x89989d;
    Throw::LogAssert();
    pTStack_f0 = (ThreadContext *)0x8998ad;
    puVar19 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar19 = 1;
    pTStack_f0 = (ThreadContext *)0x8998d5;
    bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                 ,0x791,"(!threadContext->IsDisableImplicitException())",
                                 "!threadContext->IsDisableImplicitException()");
    if (!bVar12) goto LAB_00899fa2;
    *puVar19 = 0;
  }
  pTStack_f0 = (ThreadContext *)0x8998e9;
  BVar15 = RecyclableObject::IsExternal((RecyclableObject *)function);
  pTStack_f0 = (ThreadContext *)0x8998fb;
  ScriptContext::VerifyAlive(this,(uint)(BVar15 == 0),(ScriptContext *)0x0);
  if (this_00->isScriptActive == false) {
    AssertCount = AssertCount + 1;
    pTStack_f0 = (ThreadContext *)0x899916;
    Throw::LogAssert();
    pTStack_f0 = (ThreadContext *)0x899926;
    puVar19 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar19 = 1;
    pTStack_f0 = (ThreadContext *)0x89994e;
    bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                 ,0x793,"(threadContext->IsScriptActive())",
                                 "threadContext->IsScriptActive()");
    if (!bVar12) goto LAB_00899fa2;
    *puVar19 = 0;
  }
  if (this_00->callRootLevel == 0) {
    AssertCount = AssertCount + 1;
    pTStack_f0 = (ThreadContext *)0x899974;
    Throw::LogAssert();
    pTStack_f0 = (ThreadContext *)0x899984;
    puVar19 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar19 = 1;
    pTStack_f0 = (ThreadContext *)0x8999ac;
    bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                 ,0x794,"(threadContext->IsInScript())",
                                 "threadContext->IsInScript()");
    if (!bVar12) goto LAB_00899fa2;
    *puVar19 = 0;
  }
  pTStack_f0 = (ThreadContext *)0x8999c0;
  this_02 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)function);
  if (asmJsReturn == (AsmJsReturnStruct *)0x0) {
    pTStack_f0 = (ThreadContext *)0x8999d6;
    bVar12 = FunctionProxy::IsInDebugMode((FunctionProxy *)this_02);
    pTStack_f0 = (ThreadContext *)0x8999e1;
    bVar13 = ScriptContext::IsScriptContextInDebugMode(this);
    if (bVar12 != bVar13) {
      if ((((this_02->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
           field_0xa8 & 4) == 0) {
        pTStack_f0 = (ThreadContext *)&LAB_00899fae;
        Throw::FatalInternalError(-0x7fffbffb);
      }
      pTStack_f0 = (ThreadContext *)0x8999ff;
      bVar12 = FunctionProxy::IsInDebugMode((FunctionProxy *)this_02);
      if (bVar12) {
        AssertCount = AssertCount + 1;
        pTStack_f0 = (ThreadContext *)0x899a11;
        Throw::LogAssert();
        pTStack_f0 = (ThreadContext *)0x899a21;
        puVar19 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar19 = 1;
        pTStack_f0 = (ThreadContext *)0x899a49;
        bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                     ,0x79c,"(!executeFunction->IsInDebugMode())",
                                     "!executeFunction->IsInDebugMode()");
        if (!bVar12) goto LAB_00899fa2;
        *puVar19 = 0;
      }
    }
  }
  pTStack_f0 = (ThreadContext *)0x899a5d;
  uVar16 = FunctionBody::GetInterpretedCount(this_02);
  if (uVar16 == 0) {
    pTStack_f0 = (ThreadContext *)0x899a69;
    FunctionBody::TraceInterpreterExecutionMode(this_02);
  }
  uVar2 = this_00->loopDepth;
  if ((uVar2 != '\0') &&
     (((this_02->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 4) == 0)) {
    pTStack_f0 = (ThreadContext *)0x899a88;
    FunctionBody::SetWasCalledFromLoop(this_02);
  }
  pTStack_f0 = (ThreadContext *)0x899a90;
  bVar12 = ShouldDoProfile(this_02);
  if (bVar12) {
    pTStack_f0 = (ThreadContext *)0x899aa1;
    local_90 = FunctionBody::GetDynamicProfileInfo(this_02);
    pTStack_f0 = (ThreadContext *)0x899ab1;
    ThreadContext::ClearImplicitCallFlags(this_00);
  }
  else {
    local_90 = (DynamicProfileInfo *)0x0;
  }
  pTStack_f0 = (ThreadContext *)0x899ac6;
  FunctionBody::IncreaseInterpretedCount(this_02);
  this->interpretedCount = this->interpretedCount + 1;
  pTStack_f0 = (ThreadContext *)0x899ad5;
  uVar16 = FunctionBody::GetInterpretedCount(this_02);
  if (uVar16 < this->maxFuncInterpret) {
    uVar16 = this->maxFuncInterpret;
  }
  this->maxFuncInterpret = uVar16;
  pTStack_f0 = (ThreadContext *)0x899af0;
  BVar15 = FunctionProxy::IsDeferredParseFunction((FunctionProxy *)this_02);
  if (BVar15 != 0) {
    AssertCount = AssertCount + 1;
    pTStack_f0 = (ThreadContext *)0x899b02;
    Throw::LogAssert();
    pTStack_f0 = (ThreadContext *)0x899b12;
    puVar19 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar19 = 1;
    pTStack_f0 = (ThreadContext *)0x899b3a;
    bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                 ,0x7d8,"(!executeFunction->IsDeferredParseFunction())",
                                 "Non-intrinsic functions must provide byte-code to execute");
    if (!bVar13) goto LAB_00899fa2;
    *puVar19 = 0;
  }
  pTStack_f0 = (ThreadContext *)0x899b4e;
  FunctionBody::BeginExecution(this_02);
  if (asmJsReturn == (AsmJsReturnStruct *)0x0) {
    pTStack_f0 = (ThreadContext *)0x899b66;
    bVar13 = FunctionProxy::IsCoroutine((FunctionProxy *)this_02);
    if (!bVar13) goto LAB_00899c39;
    if (((ulong)(args->super_Arguments).Info & 0x8ffffff) != 2) {
      AssertCount = AssertCount + 1;
      pTStack_f0 = (ThreadContext *)0x899b8c;
      Throw::LogAssert();
      pTStack_f0 = (ThreadContext *)0x899b9c;
      puVar19 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar19 = 1;
      pTStack_f0 = (ThreadContext *)0x899bc4;
      bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                   ,0x7e7,
                                   "(args.Info.Count == 2 && ((args.Info.Flags & CallFlags_ExtraArg) == CallFlags_None))"
                                   ,
                                   "Generator ScriptFunctions should only be invoked by generator APIs with the pair of arguments they pass in -- the generator object and a resume yield object"
                                  );
      if (!bVar13) goto LAB_00899fa2;
      *puVar19 = 0;
    }
    pTStack_f0 = (ThreadContext *)0x899bde;
    pvVar20 = Arguments::operator[](&args->super_Arguments,0);
    pTStack_f0 = (ThreadContext *)0x899be6;
    local_e8 = (undefined1  [8])VarTo<Js::JavascriptGenerator>(pvVar20);
    this_03 = (undefined1  [8])
              (((ThreadContext *)local_e8)->super_DefaultRecyclerCollectionWrapper).
              super_RecyclerCollectionWrapper.wrapperTracingDoneCallback;
    if (this_03 == (undefined1  [8])0x0) {
      pTStack_f0 = (ThreadContext *)0x899f63;
      this_03 = (undefined1  [8])
                CreateInterpreterStackFrameForGenerator
                          (function,this_02,(JavascriptGenerator *)local_e8,bVar12);
    }
    else {
      pTStack_f0 = (ThreadContext *)0x899c02;
      RVar17 = FunctionBody::GetYieldRegister(this_02);
      pTStack_f0 = (ThreadContext *)0x899c11;
      pvVar20 = Arguments::operator[](&args->super_Arguments,1);
      (&((ExecutionInfoManager *)this_03)->m_activeBPId)[RVar17] = (int64)pvVar20;
      (((ExecutionInfoManager *)this_03)->m_lastReturnLocation).m_lastFrame.CurrentStatementLoopTime
           = (uint64)local_e8;
      *(undefined4 *)&(((ExecutionInfoManager *)this_03)->m_lastExceptionLocation).m_etime = 0;
    }
    bVar13 = false;
  }
  else {
LAB_00899c39:
    pTStack_f0 = (ThreadContext *)0x899c59;
    local_84 = (uint)bVar12;
    Setup::Setup((Setup *)local_e8,function,&args->super_Arguments,false,false,false);
    uVar23 = (ulong)local_bc;
    uVar1 = uVar23 + local_c0;
    if (uVar1 < 0x8001) {
      pTStack_f0 = (ThreadContext *)0x899cfb;
      ThreadContext::ProbeStack(this->threadContext,uVar1 * 8 + 0x4000,this,unaff_retaddr);
      lVar8 = -(uVar1 * 8 + 0xf & 0xfffffffffffffff0);
      pEVar21 = (ExecutionInfoManager *)(local_e8 + lVar8);
      auStack_78 = (undefined1  [8])pEVar21;
      *(undefined8 *)((long)&pTStack_f0 + lVar8) = 0x899d24;
      memset(pEVar21,0xfe,uVar1 * 8);
      ppvVar25 = (Var *)0x0;
      bVar13 = false;
      pEVar24 = pEVar21;
    }
    else {
      local_a8 = (ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)0x0;
      pTStack_f0 = (ThreadContext *)0x899c87;
      bVar13 = ScriptContext::EnsureInterpreterArena
                         (this,(ArenaAllocator **)&stack0xffffffffffffff58);
      pTStack_f0 = (ThreadContext *)0x899c9d;
      auStack_78 = (undefined1  [8])
                   Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                   AllocInternal(local_a8,(ulong)local_c0 << 3);
      if (uVar23 == 0) {
        ppvVar25 = (Var *)0x0;
      }
      else {
        pTStack_f0 = (ThreadContext *)0x899cc9;
        ThreadContext::ProbeStack(this->threadContext,uVar23 * 8 + 0x4000,this,unaff_retaddr);
        pEVar21 = (ExecutionInfoManager *)(local_e8 + -(uVar23 * 8 + 0xf & 0xfffffffffffffff0));
        ppvVar25 = (Var *)pEVar21;
      }
      pEVar24 = (ExecutionInfoManager *)auStack_78;
    }
    pEVar21[-1].m_innerloopLastLocation.m_line = 0x899d3f;
    pEVar21[-1].m_innerloopLastLocation.m_column = 0;
    bVar14 = FunctionBody::GetHasAllocatedLoopHeaders(this_02);
    if (bVar14) {
      pEVar21[-1].m_innerloopLastLocation.m_line = 0x899d4b;
      pEVar21[-1].m_innerloopLastLocation.m_column = 0;
      loopHeaderArray = FunctionBody::GetLoopHeaderArrayPtr(this_02);
    }
    else {
      loopHeaderArray = (LoopHeader *)0x0;
    }
    pEVar21[-1].m_innerloopLastLocation.m_loopTime = -0x101010101010102;
    pEVar21[-1].m_innerloopLastLocation.m_line = 0xfefefefe;
    this_03 = auStack_78;
    uVar5 = local_84;
    pEVar21[-1].m_innerloopLastLocation.m_column = 0xfefefefe;
    bVar3 = (this_02->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47;
    pEVar21[-1].m_innerloopLastLocation.m_functionTime =
         (int64)&pEVar21[-1].m_innerloopLastLocation.m_loopTime;
    pEVar21[-1].m_innerloopLastLocation.m_eventTime = (int64)pEVar24;
    *(undefined8 *)&pEVar21[-1].m_unRestoredBreakpoints.field_0x28 = 0x899d9c;
    Setup::InitializeAllocation
              ((Setup *)local_e8,(Var *)this_03,ppvVar25,
               (bool)((bVar3 & 4) >> 2 & asmJsReturn == (AsmJsReturnStruct *)0x0),SUB41(uVar5,0),
               loopHeaderArray,pEVar21[-1].m_innerloopLastLocation.m_eventTime,
               (Var)pEVar21[-1].m_innerloopLastLocation.m_functionTime);
    piVar22 = &pEVar21[-1].m_innerloopLastLocation.m_loopTime;
    pEVar21[-1].m_innerloopLastLocation.m_functionTime = 0x899dab;
    ByteCodeReader::Create((ByteCodeReader *)this_03,this_02,0);
    piVar18 = local_80;
  }
  auStack_78 = (undefined1  [8])0x0;
  exceptionFramePopper.m_eimanager = (ExecutionInfoManager *)0x0;
  if (this->TTDShouldPerformRecordOrReplayDebuggerAction == true) {
    uVar4 = *(ushort *)
             ((long)&(((ExecutionInfoManager *)this_03)->m_lastExceptionLocation).
                     m_sourceScriptLogId + 4);
    pEVar21 = this_00->TTDExecutionInfo;
    uVar5 = *(uint *)&(args->super_Arguments).Info;
    ppvVar25 = (args->super_Arguments).Values;
    *(undefined8 *)((long)piVar22 + -8) = 0x899df7;
    TTD::ExecutionInfoManager::PushCallEvent
              (pEVar21,(JavascriptFunction *)function,uVar5 & 0xffffff,ppvVar25,
               SUB41((uVar4 & 4) >> 2,0));
    auStack_78 = (undefined1  [8])this_00->TTDExecutionInfo;
    piVar18 = local_80;
    exceptionFramePopper.m_eimanager = (ExecutionInfoManager *)function;
  }
  if (asmJsReturn == (AsmJsReturnStruct *)0x0) {
    *(undefined8 *)((long)piVar22 + -8) = 0x899e19;
    bVar14 = FunctionProxy::IsInDebugMode((FunctionProxy *)this_02);
    pvVar11 = local_98;
    pAVar10 = tmpAlloc;
    if (bVar14) {
      *(undefined8 *)((long)piVar22 + -8) = 0x899e3a;
      PushPopFrameHelper::PushPopFrameHelper
                ((PushPopFrameHelper *)local_e8,(InterpreterStackFrame *)this_03,pvVar11,pAVar10);
      *(undefined8 *)((long)piVar22 + -8) = 0x899e42;
      pvVar20 = DebugProcess((InterpreterStackFrame *)this_03);
      goto LAB_00899e69;
    }
  }
  pvVar11 = local_98;
  pAVar10 = tmpAlloc;
  *(undefined8 *)((long)piVar22 + -8) = 0x899e61;
  PushPopFrameHelper::PushPopFrameHelper
            ((PushPopFrameHelper *)local_e8,(InterpreterStackFrame *)this_03,pvVar11,pAVar10);
  *(undefined8 *)((long)piVar22 + -8) = 0x899e69;
  pvVar20 = Process((InterpreterStackFrame *)this_03);
LAB_00899e69:
  *(undefined8 *)((long)piVar22 + -8) = 0x899e78;
  PushPopFrameHelper::~PushPopFrameHelper((PushPopFrameHelper *)local_e8);
  *(undefined8 *)((long)piVar22 + -8) = 0x899e80;
  FunctionBody::EndExecution(this_02);
  if (this->TTDShouldPerformRecordOrReplayDebuggerAction == true) {
    auStack_78 = (undefined1  [8])0x0;
    pEVar21 = this_00->TTDExecutionInfo;
    *(undefined8 *)((long)piVar22 + -8) = 0x899ea6;
    TTD::ExecutionInfoManager::PopCallEvent(pEVar21,(JavascriptFunction *)function,pvVar20);
  }
  if (asmJsReturn != (AsmJsReturnStruct *)0x0) {
    asmJsReturn->i =
         *(int32 *)(((ExecutionInfoManager *)this_03)->m_pendingTTDBP).m_sourceScriptLogId;
    asmJsReturn->l = *(int64 *)(((ExecutionInfoManager *)this_03)->m_pendingTTDBP).m_bpId;
    asmJsReturn->d = *(double *)(((ExecutionInfoManager *)this_03)->m_pendingTTDBP).m_etime;
    asmJsReturn->f = *(float *)(((ExecutionInfoManager *)this_03)->m_pendingTTDBP).m_ftime;
    pTVar6 = *(Type **)&(((ExecutionInfoManager *)this_03)->m_pendingTTDBP).m_functionColumn;
    TVar9 = pTVar6[1];
    (asmJsReturn->simd).field_0.f64[0] = *pTVar6;
    (asmJsReturn->simd).field_0.f64[1] = TVar9;
  }
  if (bVar13 != false) {
    *(undefined8 *)((long)piVar22 + -8) = 0x899f09;
    ScriptContext::ReleaseInterpreterArena(this);
  }
  this_01 = local_90;
  if (bVar12) {
    flags = this_00->implicitCallFlags;
    *(undefined8 *)((long)piVar22 + -8) = 0x899f26;
    DynamicProfileInfo::RecordImplicitCallFlags(this_01,flags);
  }
  *(undefined8 *)((long)piVar22 + -8) = 0x899f2f;
  TTD::TTDExceptionFramePopper::~TTDExceptionFramePopper((TTDExceptionFramePopper *)auStack_78);
  this_00->loopDepth = uVar2;
  *piVar18 = *piVar18 + -1;
  return pvVar20;
}

Assistant:

Var InterpreterStackFrame::InterpreterHelper(ScriptFunction* function, ArgumentReader args, void* returnAddress, void* addressOfReturnAddress, AsmJsReturnStruct* asmJsReturn)
    {
        const bool isAsmJs = asmJsReturn != nullptr;

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        // Support for simulating partially initialized interpreter stack frame.
        InterpreterThunkStackCountTracker tracker;

        if (CONFIG_ISENABLED(InjectPartiallyInitializedInterpreterFrameErrorFlag) &&
            CONFIG_FLAG(InjectPartiallyInitializedInterpreterFrameError) == InterpreterThunkStackCountTracker::GetCount())
        {
            switch (CONFIG_FLAG(InjectPartiallyInitializedInterpreterFrameErrorType))
            {
            case 0:
                DebugBreak();
                break;
            case 1:
                Js::JavascriptError::MapAndThrowError(function->GetScriptContext(), VBSERR_InternalError);
                break;
            default:
                DebugBreak();
            }
        }
#endif
        ScriptContext* functionScriptContext = function->GetScriptContext();
        ThreadContext * threadContext = functionScriptContext->GetThreadContext();
        Assert(!threadContext->IsDisableImplicitException());
        functionScriptContext->VerifyAlive(!function->IsExternal());
        Assert(threadContext->IsScriptActive());
        Assert(threadContext->IsInScript());

        FunctionBody* executeFunction = function->GetFunctionBody();
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (!isAsmJs && executeFunction->IsInDebugMode() != functionScriptContext->IsScriptContextInDebugMode()) // debug mode mismatch
        {
            if (executeFunction->GetUtf8SourceInfo()->GetIsLibraryCode())
            {
                Assert(!executeFunction->IsInDebugMode()); // Library script byteCode is never in debug mode
            }
            else
            {
                Throw::FatalInternalError();
            }
        }
#endif

        if (executeFunction->GetInterpretedCount() == 0)
        {
            executeFunction->TraceInterpreterExecutionMode();
        }


        class AutoRestore
        {
        private:
            ThreadContext * const threadContext;
            const uint8 savedLoopDepth;

        public:
            AutoRestore(ThreadContext *const threadContext, FunctionBody *const executeFunction)
                : threadContext(threadContext),
                savedLoopDepth(threadContext->LoopDepth())
            {
                if (savedLoopDepth != 0 && !executeFunction->GetIsAsmJsFunction())
                {
                    executeFunction->SetWasCalledFromLoop();
                }
            }

            ~AutoRestore()
            {
                threadContext->SetLoopDepth(savedLoopDepth);
            }
        } autoRestore(threadContext, executeFunction);

#if ENABLE_PROFILE_INFO
        DynamicProfileInfo * dynamicProfileInfo = nullptr;
        const bool doProfile = ShouldDoProfile(executeFunction);
        if (doProfile)
        {
#if !DYNAMIC_INTERPRETER_THUNK
            executeFunction->EnsureDynamicProfileInfo();
#endif
            dynamicProfileInfo = executeFunction->GetDynamicProfileInfo();
            threadContext->ClearImplicitCallFlags();
        }
#else
        const bool doProfile = false;
#endif

        executeFunction->IncreaseInterpretedCount();
#ifdef BGJIT_STATS
        functionScriptContext->interpretedCount++;
        functionScriptContext->maxFuncInterpret = max(functionScriptContext->maxFuncInterpret, executeFunction->GetInterpretedCount());
#endif

        AssertMsg(!executeFunction->IsDeferredParseFunction(),
            "Non-intrinsic functions must provide byte-code to execute");

        executeFunction->BeginExecution();

        bool fReleaseAlloc = false;
        InterpreterStackFrame* newInstance = nullptr;

        if (!isAsmJs && executeFunction->IsCoroutine())
        {
            // If the FunctionBody is a generator then this call is being made by one of the three
            // generator resuming methods: next(), throw(), or return().  They all pass the generator
            // object as the first of two arguments.  The real user arguments are obtained from the
            // generator object.  The second argument is the resume yield object which is only needed
            // when resuming a generator and so it is only used here if a frame already exists on the
            // generator object.
            AssertOrFailFastMsg(args.Info.Count == 2 && ((args.Info.Flags & CallFlags_ExtraArg) == CallFlags_None), "Generator ScriptFunctions should only be invoked by generator APIs with the pair of arguments they pass in -- the generator object and a resume yield object");

            JavascriptGenerator* generator = VarTo<JavascriptGenerator>(args[0]);
            newInstance = generator->GetFrame();

            if (newInstance != nullptr)
            {
                newInstance->SetNonVarReg(executeFunction->GetYieldRegister(), args[1]);

                // The debugger relies on comparing stack addresses of frames to decide when a step_out is complete so
                // give the InterpreterStackFrame a legit enough stack address to make this comparison work.
                newInstance->m_stackAddress = reinterpret_cast<DWORD_PTR>(&generator);

                newInstance->retOffset = 0;
            }
            else
            {
                newInstance = CreateInterpreterStackFrameForGenerator(function, executeFunction, generator, doProfile);
            }
        }
        else
        {
            InterpreterStackFrame::Setup setup(function, args);
            size_t varAllocCount = setup.GetAllocationVarCount();
            size_t stackVarAllocCount = setup.GetStackAllocationVarCount();
            size_t varSizeInBytes;

            //
            // Allocate a new InterpreterStackFrame instance on the interpreter's virtual stack.
            //
            DWORD_PTR stackAddr;

            Var* allocation;
            Var* stackAllocation = nullptr;

            // If the locals area exceeds a certain limit, allocate it from a private arena rather than
            // this frame. The current limit is based on an old assert on the number of locals we would allow here.
            if ((varAllocCount + stackVarAllocCount) > InterpreterStackFrame::LocalsThreshold)
            {
                ArenaAllocator *tmpAlloc = nullptr;
                fReleaseAlloc = functionScriptContext->EnsureInterpreterArena(&tmpAlloc);
                varSizeInBytes = varAllocCount * sizeof(Var);
                allocation = (Var*)tmpAlloc->Alloc(varSizeInBytes);
                stackAddr = reinterpret_cast<DWORD_PTR>(&allocation); // use a stack address so the debugger stepping logic works (step-out, for example, compares stack depths to determine when to complete the step)
                if (stackVarAllocCount != 0)
                {
                    size_t stackVarSizeInBytes = stackVarAllocCount * sizeof(Var);
                    PROBE_STACK_PARTIAL_INITIALIZED_INTERPRETER_FRAME(functionScriptContext, Js::Constants::MinStackInterpreter + stackVarSizeInBytes);
                    stackAllocation = (Var*)_alloca(stackVarSizeInBytes);
                }
            }
            else
            {
                varSizeInBytes = (varAllocCount + stackVarAllocCount) * sizeof(Var);
                PROBE_STACK_PARTIAL_INITIALIZED_INTERPRETER_FRAME(functionScriptContext, Js::Constants::MinStackInterpreter + varSizeInBytes);
                allocation = (Var*)_alloca(varSizeInBytes);
#if DBG
                memset(allocation, 0xFE, varSizeInBytes);
#endif
                stackAddr = reinterpret_cast<DWORD_PTR>(allocation);
            }

            /*
            * If the function has any loop headers, we allocate an array for the loop headers wrappers, and
            * reference the wrappers in the array. We then push the pointer to the array onto the stack itself.
            * We do this so that while the function is being interpreted, we don't want the jitted loop
            * bodies to be collected, even if the loop body isn't being executed. The loop body will
            * get collected when the function has been JITted, and when the function exits the interpreter.
            * The array contains nulls if the loop body isn't jitted (or hasn't been jitted yet) but
            * it's cheaper to just copy them all into the recycler array rather than just the ones that
            * have been jitted.
            */
            LoopHeader* loopHeaderArray = nullptr;

            if (executeFunction->GetHasAllocatedLoopHeaders())
            {
                // Loop header array is recycler allocated, so we push it on the stack
                // When we scan the stack, we'll recognize it as a recycler allocated
                // object, and mark it's contents and keep the individual loop header
                // wrappers alive
                loopHeaderArray = executeFunction->GetLoopHeaderArrayPtr();
            }

#if DBG
            Js::RecyclableObject * invalidStackVar = (Js::RecyclableObject*)_alloca(sizeof(Js::RecyclableObject));
            memset(reinterpret_cast<void*>(invalidStackVar), 0xFE, sizeof(Js::RecyclableObject));
#endif

            newInstance = setup.InitializeAllocation(allocation, stackAllocation, executeFunction->GetHasImplicitArgIns() && !isAsmJs, doProfile, loopHeaderArray, stackAddr
#if DBG
                , invalidStackVar
#endif
                );

            newInstance->m_reader.Create(executeFunction);
        }
        //
        // Execute the function's byte-code, returning the return-value:
        // - Mark that the function is current executing and may not be modified.
        //

#if ENABLE_TTD
        TTD::TTDExceptionFramePopper exceptionFramePopper;
        if (SHOULD_DO_TTD_STACK_STMT_OP(functionScriptContext))
        {
            bool isInFinally = newInstance->TestFlags(Js::InterpreterStackFrameFlags_WithinFinallyBlock);

            threadContext->TTDExecutionInfo->PushCallEvent(function, args.Info.Count, args.Values, isInFinally);
            exceptionFramePopper.PushInfo(threadContext->TTDExecutionInfo, function);
        }
#endif

        Var aReturn = nullptr;

        {
#ifdef ENABLE_SCRIPT_DEBUGGING
            if (!isAsmJs && executeFunction->IsInDebugMode())
            {
#if DYNAMIC_INTERPRETER_THUNK
                PushPopFrameHelper pushPopFrameHelper(newInstance, returnAddress, addressOfReturnAddress);
                aReturn = newInstance->DebugProcess();
#else
                aReturn = newInstance->DebugProcessThunk(_ReturnAddress(), _AddressOfReturnAddress());
#endif
            }
            else
#endif
            {
#if DYNAMIC_INTERPRETER_THUNK
                PushPopFrameHelper pushPopFrameHelper(newInstance, returnAddress, addressOfReturnAddress);
                aReturn = newInstance->Process();
#else
                aReturn = newInstance->ProcessThunk(_ReturnAddress(), _AddressOfReturnAddress());
#endif
            }
        }

        executeFunction->EndExecution();

#if ENABLE_TTD
        if (SHOULD_DO_TTD_STACK_STMT_OP(functionScriptContext))
        {
            exceptionFramePopper.PopInfo();
            threadContext->TTDExecutionInfo->PopCallEvent(function, aReturn);
        }
#endif

#ifdef ASMJS_PLAT
        if (isAsmJs)
        {
            asmJsReturn->i = newInstance->GetRegRawInt(0);
            asmJsReturn->l = newInstance->GetRegRawInt64(0);
            asmJsReturn->d = newInstance->GetRegRawDouble(0);
            asmJsReturn->f = newInstance->GetRegRawFloat(0);
            asmJsReturn->simd = newInstance->GetRegRawSimd(0);
        }
#endif

        if (fReleaseAlloc)
        {
            functionScriptContext->ReleaseInterpreterArena();
        }

#if ENABLE_PROFILE_INFO
        if (doProfile)
        {
            dynamicProfileInfo->RecordImplicitCallFlags(threadContext->GetImplicitCallFlags());
        }
#endif

        return aReturn;
    }